

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

back_insert_iterator<fmt::v7::detail::buffer<char>_>
fmt::v7::detail::
write_float<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,fmt::v7::detail::dragonbox::decimal_fp<float>,char>
          (back_insert_iterator<fmt::v7::detail::buffer<char>_> out,decimal_fp<float> *fp,
          basic_format_specs<char> *specs,float_specs fspecs,char decimal_point)

{
  iterator it;
  bool bVar1;
  type tVar2;
  int iVar3;
  int *piVar4;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> it_00;
  float_specs in_RCX;
  int *in_RDX;
  undefined4 *in_RSI;
  buffer<char> *in_RDI;
  char in_R8B;
  int num_zeros;
  int num_zeros_3;
  int num_zeros_2;
  int exp;
  anon_class_28_7_94dcc806 write;
  char exp_char;
  int exp_digits;
  int abs_output_exp;
  int num_zeros_1;
  anon_class_12_2_f0c9b3c6 use_exp_format;
  int output_exp;
  size_t size;
  sign_t sign;
  int significand_size;
  significand_type significand;
  undefined4 in_stack_fffffffffffffe80;
  int value;
  undefined4 in_stack_fffffffffffffe84;
  undefined2 in_stack_fffffffffffffe88;
  undefined1 in_stack_fffffffffffffe8a;
  undefined1 in_stack_fffffffffffffe8b;
  undefined1 uVar5;
  undefined4 in_stack_fffffffffffffe8c;
  basic_format_specs<char> *in_stack_fffffffffffffe90;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> in_stack_fffffffffffffe98;
  anon_class_28_7_94dcc806 *in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  int local_b0;
  int local_64;
  int local_5c;
  int local_58;
  int local_54;
  anon_class_12_2_f0c9b3c6 local_50;
  int local_44;
  ulong local_40;
  basic_format_specs<char> local_38;
  int *local_28;
  undefined4 *local_20;
  float_specs local_18;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> local_10;
  buffer<char> *local_8;
  
  local_38._8_4_ = *in_RSI;
  local_38._15_1_ = in_R8B;
  local_28 = in_RDX;
  local_20 = in_RSI;
  local_18 = in_RCX;
  local_10.container = in_RDI;
  local_38.precision = get_significand_size<float>((decimal_fp<float> *)0x26b1af);
  local_38.width = (uint)local_18._4_4_ >> 8 & 0xff;
  tVar2 = to_unsigned<int>(local_38.precision);
  local_40 = (ulong)(tVar2 + (local_38.width != 0));
  local_50.output_exp = local_20[1] + local_38.precision + -1;
  local_50.fspecs = local_18;
  local_44 = local_50.output_exp;
  bVar1 = write_float<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_fmt::v7::detail::dragonbox::decimal_fp<float>,_char>
          ::anon_class_12_2_f0c9b3c6::operator()(&local_50);
  if (bVar1) {
    local_54 = 0;
    if (((uint)local_18._4_4_ >> 0x14 & 1) == 0) {
      if (local_38.precision == 1) {
        local_38._15_1_ = '\0';
      }
    }
    else {
      local_58 = local_18.precision - local_38.precision;
      local_5c = 0;
      piVar4 = std::max<int>(&local_58,&local_5c);
      local_54 = *piVar4;
      tVar2 = to_unsigned<int>(local_54);
      local_40 = tVar2 + local_40;
    }
    iVar3 = local_44;
    if (local_44 < 0) {
      iVar3 = -local_44;
    }
    local_64 = 2;
    if ((99 < iVar3) && (local_64 = 3, 999 < iVar3)) {
      local_64 = 4;
    }
    tVar2 = to_unsigned<int>((local_38._15_1_ != '\0') + 2 + local_64);
    local_40 = tVar2 + local_40;
    uVar5 = 0x45;
    if ((local_18._4_4_ & 0x10000) == 0) {
      uVar5 = 0x65;
    }
    if (*local_28 < 1) {
      reserve<std::back_insert_iterator<fmt::v7::detail::buffer<char>>>(&local_10,local_40);
      it.container._4_4_ = in_stack_fffffffffffffecc;
      it.container._0_4_ = in_stack_fffffffffffffec8;
      it_00 = write_float<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_fmt::v7::detail::dragonbox::decimal_fp<float>,_char>
              ::anon_class_28_7_94dcc806::operator()(in_stack_fffffffffffffec0,it);
      local_8 = (buffer<char> *)
                base_iterator<std::back_insert_iterator<fmt::v7::detail::buffer<char>>>
                          (local_10,it_00);
    }
    else {
      local_8 = (buffer<char> *)
                write_padded<(fmt::v7::align::type)2,std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char,fmt::v7::detail::write_float<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,fmt::v7::detail::dragonbox::decimal_fp<float>,char>(std::back_insert_iterator<fmt::v7::detail::buffer<char>>,fmt::v7::detail::dragonbox::decimal_fp<float>const&,fmt::v7::basic_format_specs<char>const&,fmt::v7::detail::float_specs,char)::_lambda(std::back_insert_iterator<fmt::v7::detail::buffer<char>>)_1_&>
                          (in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
                           CONCAT44(iVar3,CONCAT13(uVar5,CONCAT12(0x65,in_stack_fffffffffffffe88))),
                           (anon_class_28_7_94dcc806 *)
                           CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
    }
  }
  else {
    local_b0 = local_20[1] + local_38.precision;
    if ((int)local_20[1] < 0) {
      if (local_b0 < 1) {
        local_b0 = -local_b0;
        if (((local_38.precision == 0) && (-1 < local_18.precision)) &&
           (local_18.precision < local_b0)) {
          local_b0 = local_18.precision;
        }
        tVar2 = to_unsigned<int>(local_b0);
        local_40 = (tVar2 + 2) + local_40;
        local_8 = (buffer<char> *)
                  write_padded<(fmt::v7::align::type)2,std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char,fmt::v7::detail::write_float<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,fmt::v7::detail::dragonbox::decimal_fp<float>,char>(std::back_insert_iterator<fmt::v7::detail::buffer<char>>,fmt::v7::detail::dragonbox::decimal_fp<float>const&,fmt::v7::basic_format_specs<char>const&,fmt::v7::detail::float_specs,char)::_lambda(std::back_insert_iterator<fmt::v7::detail::buffer<char>>)_4_>
                            ((buffer<char> *)&stack0xfffffffffffffecc,&local_38,
                             CONCAT44(in_stack_fffffffffffffe8c,
                                      CONCAT13(in_stack_fffffffffffffe8b,
                                               CONCAT12(in_stack_fffffffffffffe8a,
                                                        in_stack_fffffffffffffe88))),
                             (anon_class_48_6_9afe1116 *)
                             CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
      }
      else {
        if (((uint)local_18._4_4_ >> 0x14 & 1) == 0) {
          iVar3 = 0;
        }
        else {
          iVar3 = local_18.precision - local_38.precision;
        }
        value = iVar3;
        if (iVar3 < 1) {
          value = 0;
        }
        tVar2 = to_unsigned<int>(value);
        local_40 = (tVar2 + 1) + local_40;
        local_8 = (buffer<char> *)
                  write_padded<(fmt::v7::align::type)2,std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char,fmt::v7::detail::write_float<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,fmt::v7::detail::dragonbox::decimal_fp<float>,char>(std::back_insert_iterator<fmt::v7::detail::buffer<char>>,fmt::v7::detail::dragonbox::decimal_fp<float>const&,fmt::v7::basic_format_specs<char>const&,fmt::v7::detail::float_specs,char)::_lambda(std::back_insert_iterator<fmt::v7::detail::buffer<char>>)_3_>
                            (in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
                             CONCAT44(in_stack_fffffffffffffe8c,
                                      CONCAT13(in_stack_fffffffffffffe8b,
                                               CONCAT12(in_stack_fffffffffffffe8a,
                                                        in_stack_fffffffffffffe88))),
                             (anon_class_48_6_48d028d1 *)CONCAT44(iVar3,value));
      }
    }
    else {
      tVar2 = to_unsigned<int>(local_20[1]);
      local_40 = tVar2 + local_40;
      local_b0 = local_18.precision - local_b0;
      if (((uint)local_18._4_4_ >> 0x14 & 1) != 0) {
        if ((local_b0 < 1) && (local_18._4_1_ != '\x02')) {
          local_b0 = 1;
        }
        if (0 < local_b0) {
          tVar2 = to_unsigned<int>(local_b0);
          local_40 = tVar2 + local_40;
        }
      }
      local_8 = (buffer<char> *)
                write_padded<(fmt::v7::align::type)2,std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char,fmt::v7::detail::write_float<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,fmt::v7::detail::dragonbox::decimal_fp<float>,char>(std::back_insert_iterator<fmt::v7::detail::buffer<char>>,fmt::v7::detail::dragonbox::decimal_fp<float>const&,fmt::v7::basic_format_specs<char>const&,fmt::v7::detail::float_specs,char)::_lambda(std::back_insert_iterator<fmt::v7::detail::buffer<char>>)_2_>
                          (in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
                           CONCAT44(in_stack_fffffffffffffe8c,
                                    CONCAT13(in_stack_fffffffffffffe8b,
                                             CONCAT12(in_stack_fffffffffffffe8a,
                                                      in_stack_fffffffffffffe88))),
                           (anon_class_56_7_a2a26a24 *)
                           CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
    }
  }
  return (back_insert_iterator<fmt::v7::detail::buffer<char>_>)local_8;
}

Assistant:

OutputIt write_float(OutputIt out, const DecimalFP& fp,
                     const basic_format_specs<Char>& specs, float_specs fspecs,
                     Char decimal_point) {
  auto significand = fp.significand;
  int significand_size = get_significand_size(fp);
  static const Char zero = static_cast<Char>('0');
  auto sign = fspecs.sign;
  size_t size = to_unsigned(significand_size) + (sign ? 1 : 0);
  using iterator = remove_reference_t<decltype(reserve(out, 0))>;

  int output_exp = fp.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (fspecs.format == float_format::exp) return true;
    if (fspecs.format != float_format::general) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4, exp_upper = 16;
    return output_exp < exp_lower ||
           output_exp >= (fspecs.precision > 0 ? fspecs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (fspecs.showpoint) {
      num_zeros = (std::max)(fspecs.precision - significand_size, 0);
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = fspecs.upper ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = std::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0 ? write_padded<align::right>(out, specs, size, write)
                           : base_iterator(out, write(reserve(out, size)));
  }

  int exp = fp.exponent + significand_size;
  if (fp.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(fp.exponent);
    int num_zeros = fspecs.precision - exp;
#ifdef FMT_FUZZ
    if (num_zeros > 5000)
      throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
    if (fspecs.showpoint) {
      if (num_zeros <= 0 && fspecs.format != float_format::fixed) num_zeros = 1;
      if (num_zeros > 0) size += to_unsigned(num_zeros);
    }
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      it = write_significand<Char>(it, significand, significand_size);
      it = std::fill_n(it, fp.exponent, zero);
      if (!fspecs.showpoint) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? std::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = fspecs.showpoint ? fspecs.precision - significand_size : 0;
    size += 1 + to_unsigned(num_zeros > 0 ? num_zeros : 0);
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point);
      return num_zeros > 0 ? std::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && fspecs.precision >= 0 &&
      fspecs.precision < num_zeros) {
    num_zeros = fspecs.precision;
  }
  size += 2 + to_unsigned(num_zeros);
  return write_padded<align::right>(out, specs, size, [&](iterator it) {
    if (sign) *it++ = static_cast<Char>(data::signs[sign]);
    *it++ = zero;
    if (num_zeros == 0 && significand_size == 0 && !fspecs.showpoint) return it;
    *it++ = decimal_point;
    it = std::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}